

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

uint8_t unicode_utf8_to_byte(string *utf8)

{
  int iVar1;
  mapped_type *pmVar2;
  key_type *in_stack_ffffffffffffffe8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  *in_stack_fffffffffffffff0;
  
  if (unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_);
    if (iVar1 != 0) {
      unicode_utf8_to_byte_map_abi_cxx11_();
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
                   ::~unordered_map,
                   &unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&unicode_utf8_to_byte(std::__cxx11::string_const&)::map_abi_cxx11_);
    }
  }
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::at(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return *pmVar2;
}

Assistant:

uint8_t unicode_utf8_to_byte(const std::string & utf8) {
    static std::unordered_map<std::string, uint8_t> map = unicode_utf8_to_byte_map();
    return map.at(utf8);
}